

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  Id IVar1;
  byte bVar2;
  uintptr_t uVar3;
  byte *pbVar4;
  bool bVar5;
  const_iterator cVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  Expression *pEVar10;
  Expression *pEVar11;
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  *p_Var12;
  long lVar13;
  long lVar14;
  Switch *cast;
  
  IVar1 = curr->_id;
  pEVar11 = curr;
  p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
             *)this;
  if (IVar1 < LoopId) {
    if (IVar1 == BlockId) goto LAB_00147714;
    if (IVar1 == InvalidId) goto LAB_00147eb4;
  }
  else if ((IVar1 == LoopId) || (IVar1 == TryId)) {
LAB_00147714:
    if (curr[1].type.id != 0) {
      pEVar11 = curr + 1;
      p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                 *)((long)this + 0x158);
      pEVar10 = pEVar11;
      cVar6 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)p_Var12,(key_type *)pEVar11);
      if (cVar6._M_node == (_Base_ptr)((long)this + 0x160)) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>(p_Var12,(Name *)pEVar11);
      }
      else {
        p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                   *)this;
        fixAfterChanges::Fixer::replace((Fixer *)this);
        pEVar11 = pEVar10;
      }
    }
  }
  else if (IVar1 == NumExpressionIds) goto LAB_00147eb4;
  IVar1 = curr->_id;
  if (IVar1 < RethrowId) {
    if (IVar1 < TryId) {
      if (IVar1 != BreakId) {
        if (IVar1 != SwitchId) {
          if (IVar1 != InvalidId) {
            return;
          }
          goto LAB_00147eb4;
        }
        uVar3 = curr[3].type.id;
        if (uVar3 != 0) {
          uVar8 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                  *(long *)((long)this + 0xd8);
          if (uVar8 == 0) goto LAB_00147ecc;
          if (1 < uVar8) {
            uVar7 = (int)uVar8 - 2;
            pEVar11 = (Expression *)((long)this + 0xe0);
            do {
              pEVar10 = (Expression *)(*(long *)((long)this + 0x130) + -0x50);
              if (uVar7 < 10) {
                pEVar10 = pEVar11;
              }
              pbVar4 = (byte *)(&(((IString *)&pEVar10->_id)->str)._M_len)[uVar7];
              bVar2 = *pbVar4;
              if (bVar2 < 3) {
                if (bVar2 == 1) goto LAB_001477ff;
                if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147813:
                if (uVar7 == 0) {
                  uVar7 = 0;
                  p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                             *)0x0;
                  goto LAB_00147822;
                }
                uVar7 = uVar7 - 1;
                bVar5 = true;
              }
              else {
                if ((bVar2 != 3) && (bVar2 != 0x34)) {
                  if (bVar2 != 0x60) goto LAB_00147813;
                  goto LAB_00147eb4;
                }
LAB_001477ff:
                if (*(uintptr_t *)(pbVar4 + 0x18) != uVar3) goto LAB_00147813;
                p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                           *)0x1;
LAB_00147822:
                bVar5 = false;
              }
            } while (bVar5);
            if (((ulong)p_Var12 & 1) != 0) goto LAB_00147838;
          }
          fixAfterChanges::Fixer::replace((Fixer *)this);
        }
LAB_00147838:
        if (curr[1].type.id == 0) {
          return;
        }
        uVar8 = 0;
        do {
          lVar14 = *(long *)(*(long *)(curr + 1) + 8 + uVar8 * 0x10);
          if (lVar14 != 0) {
            uVar9 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar9 == 0) goto LAB_00147ecc;
            if (1 < uVar9) {
              uVar7 = (int)uVar9 - 2;
              do {
                lVar13 = *(long *)((long)this + 0x130) + -0x50;
                if (uVar7 < 10) {
                  lVar13 = (long)this + 0xe0;
                }
                pbVar4 = *(byte **)(lVar13 + (ulong)uVar7 * 8);
                bVar2 = *pbVar4;
                if (bVar2 < 3) {
                  if (bVar2 == 1) goto LAB_001478c7;
                  if (bVar2 == 0) goto LAB_00147eb4;
LAB_001478da:
                  if (uVar7 == 0) {
                    uVar7 = 0;
                    pEVar11 = (Expression *)0x0;
                    goto LAB_001478e9;
                  }
                  uVar7 = uVar7 - 1;
                  bVar5 = true;
                }
                else {
                  if ((bVar2 != 3) && (bVar2 != 0x34)) {
                    if (bVar2 != 0x60) goto LAB_001478da;
                    goto LAB_00147eb4;
                  }
LAB_001478c7:
                  if (*(long *)(pbVar4 + 0x18) != lVar14) goto LAB_001478da;
                  pEVar11 = (Expression *)0x1;
LAB_001478e9:
                  bVar5 = false;
                }
              } while (bVar5);
              if (((ulong)pEVar11 & 1) != 0) goto LAB_001478fe;
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
          }
LAB_001478fe:
          uVar8 = (ulong)((int)uVar8 + 1);
          if (curr[1].type.id <= uVar8) {
            return;
          }
        } while( true );
      }
      uVar3 = curr[1].type.id;
      if (uVar3 == 0) {
        return;
      }
      uVar8 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
              *(long *)((long)this + 0xd8);
      if (uVar8 == 0) goto LAB_00147ecc;
      if (uVar8 < 2) goto LAB_00147e95;
      uVar7 = (int)uVar8 - 2;
      do {
        lVar14 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar7 < 10) {
          lVar14 = (long)this + 0xe0;
        }
        pbVar4 = *(byte **)(lVar14 + (ulong)uVar7 * 8);
        bVar2 = *pbVar4;
        if (bVar2 < 3) {
          if (bVar2 == 1) goto LAB_00147c36;
          if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147c4a:
          if (uVar7 == 0) {
            uVar7 = 0;
            p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                       *)0x0;
            goto LAB_00147c59;
          }
          uVar7 = uVar7 - 1;
          bVar5 = true;
        }
        else {
          if ((bVar2 != 3) && (bVar2 != 0x34)) {
            if (bVar2 != 0x60) goto LAB_00147c4a;
            goto LAB_00147eb4;
          }
LAB_00147c36:
          if (*(uintptr_t *)(pbVar4 + 0x18) != uVar3) goto LAB_00147c4a;
          p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                     *)0x1;
LAB_00147c59:
          bVar5 = false;
        }
      } while (bVar5);
    }
    else {
      if (IVar1 != TryId) {
        if (IVar1 != TryTableId) {
          return;
        }
        if (*(long *)(curr + 4) == 0) {
          return;
        }
        uVar8 = 0;
        do {
          lVar14 = *(long *)(curr[3].type.id + 8 + uVar8 * 0x10);
          if (lVar14 != 0) {
            uVar9 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar9 == 0) goto LAB_00147ecc;
            if (1 < uVar9) {
              uVar7 = (int)uVar9 - 2;
              do {
                lVar13 = *(long *)((long)this + 0x130) + -0x50;
                if (uVar7 < 10) {
                  lVar13 = (long)this + 0xe0;
                }
                pbVar4 = *(byte **)(lVar13 + (ulong)uVar7 * 8);
                bVar2 = *pbVar4;
                if (bVar2 < 3) {
                  if (bVar2 == 1) goto LAB_00147aaa;
                  if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147abd:
                  if (uVar7 == 0) {
                    uVar7 = 0;
                    pEVar11 = (Expression *)0x0;
                    goto LAB_00147acc;
                  }
                  uVar7 = uVar7 - 1;
                  bVar5 = true;
                }
                else {
                  if ((bVar2 != 3) && (bVar2 != 0x34)) {
                    if (bVar2 != 0x60) goto LAB_00147abd;
                    goto LAB_00147eb4;
                  }
LAB_00147aaa:
                  if (*(long *)(pbVar4 + 0x18) != lVar14) goto LAB_00147abd;
                  pEVar11 = (Expression *)0x1;
LAB_00147acc:
                  bVar5 = false;
                }
              } while (bVar5);
              if (((ulong)pEVar11 & 1) != 0) goto LAB_00147ae1;
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
          }
LAB_00147ae1:
          uVar8 = (ulong)((int)uVar8 + 1);
          if (*(ulong *)(curr + 4) <= uVar8) {
            return;
          }
        } while( true );
      }
      if (*(long *)(curr + 7) == 0) {
        return;
      }
      uVar8 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
              *(long *)((long)this + 0xd8);
      if (uVar8 == 0) goto LAB_00147ecc;
      if (uVar8 < 2) goto LAB_00147e95;
      uVar7 = (int)uVar8 - 2;
      do {
        lVar14 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar7 < 10) {
          lVar14 = (long)this + 0xe0;
        }
        pbVar4 = *(byte **)(lVar14 + (ulong)uVar7 * 8);
        bVar2 = *pbVar4;
        if (bVar2 < 3) {
          if (bVar2 == 1) goto LAB_00147dc0;
          if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147dd4:
          if (uVar7 == 0) {
            uVar7 = 0;
            p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                       *)0x0;
            goto LAB_00147de3;
          }
          uVar7 = uVar7 - 1;
          bVar5 = true;
        }
        else {
          if ((bVar2 != 3) && (bVar2 != 0x34)) {
            if (bVar2 != 0x60) goto LAB_00147dd4;
            goto LAB_00147eb4;
          }
LAB_00147dc0:
          if (*(long *)(pbVar4 + 0x18) != *(long *)(curr + 7)) goto LAB_00147dd4;
          p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                     *)0x1;
LAB_00147de3:
          bVar5 = false;
        }
      } while (bVar5);
    }
  }
  else {
    if (SuspendId < IVar1) {
      if (IVar1 == ResumeId) {
        if (curr[3].type.id == 0) {
          return;
        }
        uVar8 = 0;
        do {
          lVar14 = *(long *)(*(long *)(curr + 3) + 8 + uVar8 * 0x10);
          if (lVar14 != 0) {
            uVar9 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar9 == 0) goto LAB_00147ecc;
            if (1 < uVar9) {
              uVar7 = (int)uVar9 - 2;
              do {
                lVar13 = *(long *)((long)this + 0x130) + -0x50;
                if (uVar7 < 10) {
                  lVar13 = (long)this + 0xe0;
                }
                pbVar4 = *(byte **)(lVar13 + (ulong)uVar7 * 8);
                bVar2 = *pbVar4;
                if (bVar2 < 3) {
                  if (bVar2 == 1) goto LAB_00147cf5;
                  if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147d08:
                  if (uVar7 == 0) {
                    uVar7 = 0;
                    pEVar11 = (Expression *)0x0;
                    goto LAB_00147d17;
                  }
                  uVar7 = uVar7 - 1;
                  bVar5 = true;
                }
                else {
                  if ((bVar2 != 3) && (bVar2 != 0x34)) {
                    if (bVar2 != 0x60) goto LAB_00147d08;
                    goto LAB_00147eb4;
                  }
LAB_00147cf5:
                  if (*(long *)(pbVar4 + 0x18) != lVar14) goto LAB_00147d08;
                  pEVar11 = (Expression *)0x1;
LAB_00147d17:
                  bVar5 = false;
                }
              } while (bVar5);
              if (((ulong)pEVar11 & 1) != 0) goto LAB_00147d2c;
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
          }
LAB_00147d2c:
          uVar8 = (ulong)((int)uVar8 + 1);
          if (curr[3].type.id <= uVar8) {
            return;
          }
        } while( true );
      }
      if (IVar1 == ResumeThrowId) {
        if (curr[4].type.id == 0) {
          return;
        }
        uVar8 = 0;
        do {
          lVar14 = *(long *)(*(long *)(curr + 4) + 8 + uVar8 * 0x10);
          if (lVar14 != 0) {
            uVar9 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
                    *(long *)((long)this + 0xd8);
            if (uVar9 == 0) goto LAB_00147ecc;
            if (1 < uVar9) {
              uVar7 = (int)uVar9 - 2;
              do {
                lVar13 = *(long *)((long)this + 0x130) + -0x50;
                if (uVar7 < 10) {
                  lVar13 = (long)this + 0xe0;
                }
                pbVar4 = *(byte **)(lVar13 + (ulong)uVar7 * 8);
                bVar2 = *pbVar4;
                if (bVar2 < 3) {
                  if (bVar2 == 1) goto LAB_001479bd;
                  if (bVar2 == 0) goto LAB_00147eb4;
LAB_001479d0:
                  if (uVar7 == 0) {
                    uVar7 = 0;
                    pEVar11 = (Expression *)0x0;
                    goto LAB_001479df;
                  }
                  uVar7 = uVar7 - 1;
                  bVar5 = true;
                }
                else {
                  if ((bVar2 != 3) && (bVar2 != 0x34)) {
                    if (bVar2 != 0x60) goto LAB_001479d0;
                    goto LAB_00147eb4;
                  }
LAB_001479bd:
                  if (*(long *)(pbVar4 + 0x18) != lVar14) goto LAB_001479d0;
                  pEVar11 = (Expression *)0x1;
LAB_001479df:
                  bVar5 = false;
                }
              } while (bVar5);
              if (((ulong)pEVar11 & 1) != 0) goto LAB_001479f4;
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
          }
LAB_001479f4:
          uVar8 = (ulong)((int)uVar8 + 1);
          if (curr[4].type.id <= uVar8) {
            return;
          }
        } while( true );
      }
      if (IVar1 != NumExpressionIds) {
        return;
      }
LAB_00147eb4:
      wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                 ,0x103);
    }
    if (IVar1 == RethrowId) {
      uVar3 = curr[1].type.id;
      if (uVar3 == 0) {
        return;
      }
      uVar8 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
              *(long *)((long)this + 0xd8);
      if (uVar8 == 0) goto LAB_00147ecc;
      if (uVar8 < 2) goto LAB_00147e95;
      uVar7 = (int)uVar8 - 2;
      do {
        lVar14 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar7 < 10) {
          lVar14 = (long)this + 0xe0;
        }
        pbVar4 = *(byte **)(lVar14 + (ulong)uVar7 * 8);
        bVar2 = *pbVar4;
        if (bVar2 < 3) {
          if (bVar2 == 1) goto LAB_00147e68;
          if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147e78:
          if (uVar7 == 0) {
            uVar7 = 0;
            p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                       *)0x0;
            goto LAB_00147e87;
          }
          uVar7 = uVar7 - 1;
          bVar5 = true;
        }
        else {
          if ((bVar2 != 3) && (bVar2 != 0x34)) {
            if (bVar2 != 0x60) goto LAB_00147e78;
            goto LAB_00147eb4;
          }
LAB_00147e68:
          if (*(uintptr_t *)(pbVar4 + 0x18) != uVar3) goto LAB_00147e78;
          p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                     *)0x1;
LAB_00147e87:
          bVar5 = false;
        }
      } while (bVar5);
    }
    else {
      if (IVar1 != BrOnId) {
        return;
      }
      if (*(long *)(curr + 2) == 0) {
        return;
      }
      uVar8 = (*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3) +
              *(long *)((long)this + 0xd8);
      if (uVar8 == 0) {
LAB_00147ecc:
        __assert_fail("!expressionStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x766,
                      "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::hasBreakTarget(Name)"
                     );
      }
      if (uVar8 < 2) goto LAB_00147e95;
      uVar7 = (int)uVar8 - 2;
      do {
        lVar14 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar7 < 10) {
          lVar14 = (long)this + 0xe0;
        }
        pbVar4 = *(byte **)(lVar14 + (ulong)uVar7 * 8);
        bVar2 = *pbVar4;
        if (bVar2 < 3) {
          if (bVar2 == 1) goto LAB_00147b87;
          if (bVar2 == 0) goto LAB_00147eb4;
LAB_00147b9b:
          if (uVar7 == 0) {
            uVar7 = 0;
            p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                       *)0x0;
            goto LAB_00147baa;
          }
          uVar7 = uVar7 - 1;
          bVar5 = true;
        }
        else {
          if ((bVar2 != 3) && (bVar2 != 0x34)) {
            if (bVar2 != 0x60) goto LAB_00147b9b;
            goto LAB_00147eb4;
          }
LAB_00147b87:
          if (*(long *)(pbVar4 + 0x18) != *(long *)(curr + 2)) goto LAB_00147b9b;
          p_Var12 = (_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                     *)0x1;
LAB_00147baa:
          bVar5 = false;
        }
      } while (bVar5);
    }
  }
  if (((ulong)p_Var12 & 1) != 0) {
    return;
  }
LAB_00147e95:
  fixAfterChanges::Fixer::replace((Fixer *)this);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }